

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

void __thiscall PlayerA::SetPlaybackSpeed(PlayerA *this,double speed)

{
  size_type sVar1;
  reference ppPVar2;
  ulong local_20;
  size_t curPlr;
  double speed_local;
  PlayerA *this_local;
  
  (this->_config).pbSpeed = speed;
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<PlayerBase_*,_std::allocator<PlayerBase_*>_>::size(&this->_avbPlrs);
    if (sVar1 <= local_20) break;
    ppPVar2 = std::vector<PlayerBase_*,_std::allocator<PlayerBase_*>_>::operator[]
                        (&this->_avbPlrs,local_20);
    (*(*ppPVar2)->_vptr_PlayerBase[0x11])((this->_config).pbSpeed);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void PlayerA::SetPlaybackSpeed(double speed)
{
	_config.pbSpeed = speed;
	for (size_t curPlr = 0; curPlr < _avbPlrs.size(); curPlr++)
		_avbPlrs[curPlr]->SetPlaybackSpeed(_config.pbSpeed);
	return;
}